

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O3

Array __thiscall notch::core::SoftmaxWithLoss::softmax(SoftmaxWithLoss *this,Array *input)

{
  _func_int **pp_Var1;
  size_t sVar2;
  float *pfVar3;
  size_t *psVar4;
  element_type *__s;
  size_t sVar5;
  float *extraout_RDX;
  float *extraout_RDX_00;
  float *extraout_RDX_01;
  float *pfVar6;
  size_t i;
  float *__p;
  float fVar7;
  float fVar8;
  float fVar9;
  Array AVar10;
  
  pp_Var1 = (_func_int **)input->_M_size;
  (this->super_ALossLayer)._vptr_ALossLayer = pp_Var1;
  __s = (element_type *)operator_new((long)pp_Var1 * 4);
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = __s;
  pfVar6 = extraout_RDX;
  if (pp_Var1 != (_func_int **)0x0) {
    memset(__s,0,(long)pp_Var1 * 4);
    pfVar6 = extraout_RDX_00;
  }
  sVar2 = input->_M_size;
  if (sVar2 == 0) {
    fVar9 = 0.0;
  }
  else {
    sVar5 = 0;
    fVar9 = 1.1754944e-38;
    do {
      fVar8 = input->_M_data[sVar5];
      if (input->_M_data[sVar5] <= fVar9) {
        fVar8 = fVar9;
      }
      sVar5 = sVar5 + 1;
      fVar9 = fVar8;
    } while (sVar2 != sVar5);
    pfVar3 = input->_M_data;
    fVar9 = 0.0;
    sVar5 = 0;
    do {
      fVar7 = expf(pfVar3[sVar5] - fVar8);
      *(float *)((long)&__s->_M_size + sVar5 * 4) = fVar7;
      fVar9 = fVar9 + fVar7;
      sVar5 = sVar5 + 1;
      pfVar6 = extraout_RDX_01;
    } while (sVar2 != sVar5);
  }
  if (0 < (long)pp_Var1) {
    psVar4 = &__s->_M_size;
    do {
      *(float *)&__s->_M_size = *(float *)&__s->_M_size * (1.0 / fVar9);
      __s = (element_type *)((long)&__s->_M_size + 4);
    } while (__s < (element_type *)((long)psVar4 + (long)pp_Var1 * 4));
  }
  AVar10._M_data = pfVar6;
  AVar10._M_size = (size_t)this;
  return AVar10;
}

Assistant:

static Array softmax(const Array &input) {
        Array softmaxOutput(0.0, input.size());
        size_t nSize = input.size();
        // a trick to avoid unbounded exponents
        float maxInput = std::numeric_limits<float>::min();
        for (size_t i = 0; i < nSize; ++i) {
            if (input[i] > maxInput) {
                maxInput = input[i];
            }
        }
        // calculate exponents
        float expTotal = 0.0;
        for (size_t i = 0; i < nSize; ++i) { // calculate exponents
            softmaxOutput[i] = std::exp(input[i] - maxInput);
            expTotal += softmaxOutput[i];
        }
        // normalize exponents
        float expTotalInv = 1.0/expTotal;
        softmaxOutput *= expTotalInv;
        return softmaxOutput;
    }